

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationPrimitiveDiscardTests.cpp
# Opt level: O0

void __thiscall
vkt::tessellation::anon_unknown_0::initPrograms
          (anon_unknown_0 *this,SourceCollections *programCollection,CaseDefinition caseDef)

{
  uint uVar1;
  char *pcVar2;
  ostream *poVar3;
  ProgramSources *pPVar4;
  bool bVar5;
  bool bVar6;
  string local_7e0;
  ShaderSource local_7c0;
  allocator<char> local_791;
  string local_790;
  ostringstream local_770 [8];
  ostringstream src_3;
  string local_5f8;
  ShaderSource local_5d8;
  allocator<char> local_5a9;
  string local_5a8;
  ostringstream local_588 [8];
  ostringstream src_2;
  uint local_408;
  bool needPointSizeWrite;
  deUint32 variant;
  deUint32 numVariants;
  ShaderSource local_3e0;
  allocator<char> local_3b1;
  string local_3b0;
  ostringstream local_390 [8];
  ostringstream src_1;
  string local_218;
  ShaderSource local_1f8;
  allocator<char> local_1c9;
  string local_1c8;
  ostringstream local_198 [8];
  ostringstream src;
  SourceCollections *programCollection_local;
  CaseDefinition caseDef_local;
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  pcVar2 = glu::getGLSLVersionDeclaration(GLSL_VERSION_310_ES);
  poVar3 = std::operator<<((ostream *)local_198,pcVar2);
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"layout(location = 0) in  highp float in_v_attr;\n");
  poVar3 = std::operator<<(poVar3,"layout(location = 0) out highp float in_tc_attr;\n");
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"void main (void)\n");
  poVar3 = std::operator<<(poVar3,"{\n");
  poVar3 = std::operator<<(poVar3,"    in_tc_attr = in_v_attr;\n");
  std::operator<<(poVar3,"}\n");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c8,"vert",&local_1c9);
  pPVar4 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     ((ProgramCollection<glu::ProgramSources> *)this,&local_1c8);
  std::__cxx11::ostringstream::str();
  glu::VertexSource::VertexSource((VertexSource *)&local_1f8,&local_218);
  glu::ProgramSources::operator<<(pPVar4,&local_1f8);
  glu::VertexSource::~VertexSource((VertexSource *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::allocator<char>::~allocator(&local_1c9);
  std::__cxx11::ostringstream::~ostringstream(local_198);
  std::__cxx11::ostringstream::ostringstream(local_390);
  pcVar2 = glu::getGLSLVersionDeclaration(GLSL_VERSION_310_ES);
  poVar3 = std::operator<<((ostream *)local_390,pcVar2);
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"#extension GL_EXT_tessellation_shader : require\n");
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"layout(vertices = 1) out;\n");
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"layout(location = 0) in highp float in_tc_attr[];\n");
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"layout(location = 0) patch out highp vec2 in_te_positionScale;\n"
                          );
  poVar3 = std::operator<<(poVar3,
                           "layout(location = 1) patch out highp vec2 in_te_positionOffset;\n");
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"void main (void)\n");
  poVar3 = std::operator<<(poVar3,"{\n");
  poVar3 = std::operator<<(poVar3,"    in_te_positionScale  = vec2(in_tc_attr[6], in_tc_attr[7]);\n"
                          );
  poVar3 = std::operator<<(poVar3,"    in_te_positionOffset = vec2(in_tc_attr[8], in_tc_attr[9]);\n"
                          );
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"    gl_TessLevelInner[0] = in_tc_attr[0];\n");
  poVar3 = std::operator<<(poVar3,"    gl_TessLevelInner[1] = in_tc_attr[1];\n");
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"    gl_TessLevelOuter[0] = in_tc_attr[2];\n");
  poVar3 = std::operator<<(poVar3,"    gl_TessLevelOuter[1] = in_tc_attr[3];\n");
  poVar3 = std::operator<<(poVar3,"    gl_TessLevelOuter[2] = in_tc_attr[4];\n");
  poVar3 = std::operator<<(poVar3,"    gl_TessLevelOuter[3] = in_tc_attr[5];\n");
  std::operator<<(poVar3,"}\n");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3b0,"tesc",&local_3b1);
  pPVar4 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     ((ProgramCollection<glu::ProgramSources> *)this,&local_3b0);
  std::__cxx11::ostringstream::str();
  glu::TessellationControlSource::TessellationControlSource
            ((TessellationControlSource *)&local_3e0,(string *)&variant);
  glu::ProgramSources::operator<<(pPVar4,&local_3e0);
  glu::TessellationControlSource::~TessellationControlSource
            ((TessellationControlSource *)&local_3e0);
  std::__cxx11::string::~string((string *)&variant);
  std::__cxx11::string::~string((string *)&local_3b0);
  std::allocator<char>::~allocator(&local_3b1);
  std::__cxx11::ostringstream::~ostringstream(local_390);
  uVar1 = 1;
  if (((undefined1  [16])caseDef & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
    uVar1 = 2;
  }
  for (local_408 = 0; local_408 < uVar1; local_408 = local_408 + 1) {
    bVar5 = ((undefined1  [16])caseDef & (undefined1  [16])0x100000000) != (undefined1  [16])0x0;
    bVar6 = local_408 == 1;
    std::__cxx11::ostringstream::ostringstream(local_588);
    pcVar2 = glu::getGLSLVersionDeclaration(GLSL_VERSION_310_ES);
    poVar3 = std::operator<<((ostream *)local_588,pcVar2);
    poVar3 = std::operator<<(poVar3,"\n");
    std::operator<<(poVar3,"#extension GL_EXT_tessellation_shader : require\n");
    if (bVar5 && bVar6) {
      std::operator<<((ostream *)local_588,"#extension GL_EXT_tessellation_point_size : require\n");
    }
    poVar3 = std::operator<<((ostream *)local_588,"\n");
    poVar3 = std::operator<<(poVar3,"layout(");
    programCollection_local._0_4_ = (TessPrimitiveType)programCollection;
    pcVar2 = getTessPrimitiveTypeShaderName((TessPrimitiveType)programCollection_local);
    poVar3 = std::operator<<(poVar3,pcVar2);
    poVar3 = std::operator<<(poVar3,", ");
    programCollection_local._4_4_ = (SpacingMode)((ulong)programCollection >> 0x20);
    pcVar2 = getSpacingModeShaderName(programCollection_local._4_4_);
    poVar3 = std::operator<<(poVar3,pcVar2);
    poVar3 = std::operator<<(poVar3,", ");
    caseDef_local.primitiveType = caseDef.primitiveType;
    pcVar2 = getWindingShaderName(caseDef_local.primitiveType);
    poVar3 = std::operator<<(poVar3,pcVar2);
    pcVar2 = "";
    if (((undefined1  [16])caseDef & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      pcVar2 = ", point_mode";
    }
    poVar3 = std::operator<<(poVar3,pcVar2);
    poVar3 = std::operator<<(poVar3,") in;\n");
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,
                             "layout(location = 0) patch in highp vec2 in_te_positionScale;\n");
    poVar3 = std::operator<<(poVar3,
                             "layout(location = 1) patch in highp vec2 in_te_positionOffset;\n");
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,
                             "layout(set = 0, binding = 0, std430) coherent restrict buffer Output {\n"
                            );
    poVar3 = std::operator<<(poVar3,"    int  numInvocations;\n");
    poVar3 = std::operator<<(poVar3,"} sb_out;\n");
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"void main (void)\n");
    poVar3 = std::operator<<(poVar3,"{\n");
    poVar3 = std::operator<<(poVar3,"    atomicAdd(sb_out.numInvocations, 1);\n");
    poVar3 = std::operator<<(poVar3,"\n");
    std::operator<<(poVar3,
                    "    gl_Position = vec4(gl_TessCoord.xy*in_te_positionScale + in_te_positionOffset, 0.0, 1.0);\n"
                   );
    if (bVar5 && bVar6) {
      std::operator<<((ostream *)local_588,"    gl_PointSize = 1.0;\n");
    }
    std::operator<<((ostream *)local_588,"}\n");
    pcVar2 = "tese";
    if (bVar5 && bVar6) {
      pcVar2 = "tese_psw";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_5a8,pcVar2,&local_5a9);
    pPVar4 = ::vk::ProgramCollection<glu::ProgramSources>::add
                       ((ProgramCollection<glu::ProgramSources> *)this,&local_5a8);
    std::__cxx11::ostringstream::str();
    glu::TessellationEvaluationSource::TessellationEvaluationSource
              ((TessellationEvaluationSource *)&local_5d8,&local_5f8);
    glu::ProgramSources::operator<<(pPVar4,&local_5d8);
    glu::TessellationEvaluationSource::~TessellationEvaluationSource
              ((TessellationEvaluationSource *)&local_5d8);
    std::__cxx11::string::~string((string *)&local_5f8);
    std::__cxx11::string::~string((string *)&local_5a8);
    std::allocator<char>::~allocator(&local_5a9);
    std::__cxx11::ostringstream::~ostringstream(local_588);
  }
  std::__cxx11::ostringstream::ostringstream(local_770);
  pcVar2 = glu::getGLSLVersionDeclaration(GLSL_VERSION_310_ES);
  poVar3 = std::operator<<((ostream *)local_770,pcVar2);
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"layout(location = 0) out mediump vec4 o_color;\n");
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"void main (void)\n");
  poVar3 = std::operator<<(poVar3,"{\n");
  poVar3 = std::operator<<(poVar3,"    o_color = vec4(1.0);\n");
  std::operator<<(poVar3,"}\n");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_790,"frag",&local_791);
  pPVar4 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     ((ProgramCollection<glu::ProgramSources> *)this,&local_790);
  std::__cxx11::ostringstream::str();
  glu::FragmentSource::FragmentSource((FragmentSource *)&local_7c0,&local_7e0);
  glu::ProgramSources::operator<<(pPVar4,&local_7c0);
  glu::FragmentSource::~FragmentSource((FragmentSource *)&local_7c0);
  std::__cxx11::string::~string((string *)&local_7e0);
  std::__cxx11::string::~string((string *)&local_790);
  std::allocator<char>::~allocator(&local_791);
  std::__cxx11::ostringstream::~ostringstream(local_770);
  return;
}

Assistant:

void initPrograms (vk::SourceCollections& programCollection, const CaseDefinition caseDef)
{
	// Vertex shader
	{
		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES) << "\n"
			<< "\n"
			<< "layout(location = 0) in  highp float in_v_attr;\n"
			<< "layout(location = 0) out highp float in_tc_attr;\n"
			<< "\n"
			<< "void main (void)\n"
			<< "{\n"
			<< "    in_tc_attr = in_v_attr;\n"
			<< "}\n";

		programCollection.glslSources.add("vert") << glu::VertexSource(src.str());
	}

	// Tessellation control shader
	{
		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES) << "\n"
			<< "#extension GL_EXT_tessellation_shader : require\n"
			<< "\n"
			<< "layout(vertices = 1) out;\n"
			<< "\n"
			<< "layout(location = 0) in highp float in_tc_attr[];\n"
			<< "\n"
			<< "layout(location = 0) patch out highp vec2 in_te_positionScale;\n"
			<< "layout(location = 1) patch out highp vec2 in_te_positionOffset;\n"
			<< "\n"
			<< "void main (void)\n"
			<< "{\n"
			<< "    in_te_positionScale  = vec2(in_tc_attr[6], in_tc_attr[7]);\n"
			<< "    in_te_positionOffset = vec2(in_tc_attr[8], in_tc_attr[9]);\n"
			<< "\n"
			<< "    gl_TessLevelInner[0] = in_tc_attr[0];\n"
			<< "    gl_TessLevelInner[1] = in_tc_attr[1];\n"
			<< "\n"
			<< "    gl_TessLevelOuter[0] = in_tc_attr[2];\n"
			<< "    gl_TessLevelOuter[1] = in_tc_attr[3];\n"
			<< "    gl_TessLevelOuter[2] = in_tc_attr[4];\n"
			<< "    gl_TessLevelOuter[3] = in_tc_attr[5];\n"
			<< "}\n";

		programCollection.glslSources.add("tesc") << glu::TessellationControlSource(src.str());
	}

	// Tessellation evaluation shader
	// When using point mode we need two variants of the shader, one for the case where
	// shaderTessellationAndGeometryPointSize is enabled (in which the tessellation evaluation
	// shader needs to write to gl_PointSize for it to be defined) and one for the case where
	// it is disabled, in which we can't write to gl_PointSize but it has a default value
	// of 1.0
	{
		const deUint32	numVariants			= caseDef.usePointMode ? 2 : 1;
		for (deUint32 variant = 0; variant < numVariants; variant++)
		{
			const bool	needPointSizeWrite	= caseDef.usePointMode && variant == 1;

			std::ostringstream src;
			src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES) << "\n"
				<< "#extension GL_EXT_tessellation_shader : require\n";
			if (needPointSizeWrite)
			{
				src << "#extension GL_EXT_tessellation_point_size : require\n";
			}
			src << "\n"
				<< "layout(" << getTessPrimitiveTypeShaderName(caseDef.primitiveType) << ", "
							 << getSpacingModeShaderName(caseDef.spacingMode) << ", "
							 << getWindingShaderName(caseDef.winding)
							 << (caseDef.usePointMode ? ", point_mode" : "") << ") in;\n"
				<< "\n"
				<< "layout(location = 0) patch in highp vec2 in_te_positionScale;\n"
				<< "layout(location = 1) patch in highp vec2 in_te_positionOffset;\n"
				<< "\n"
				<< "layout(set = 0, binding = 0, std430) coherent restrict buffer Output {\n"
				<< "    int  numInvocations;\n"
				<< "} sb_out;\n"
				<< "\n"
				<< "void main (void)\n"
				<< "{\n"
				<< "    atomicAdd(sb_out.numInvocations, 1);\n"
				<< "\n"
				<< "    gl_Position = vec4(gl_TessCoord.xy*in_te_positionScale + in_te_positionOffset, 0.0, 1.0);\n";
			if (needPointSizeWrite)
			{
				src << "    gl_PointSize = 1.0;\n";
			}
			src << "}\n";

			programCollection.glslSources.add(needPointSizeWrite ? "tese_psw" : "tese") << glu::TessellationEvaluationSource(src.str());
		}
	}

	// Fragment shader
	{
		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES) << "\n"
			<< "\n"
			<< "layout(location = 0) out mediump vec4 o_color;\n"
			<< "\n"
			<< "void main (void)\n"
			<< "{\n"
			<< "    o_color = vec4(1.0);\n"
			<< "}\n";

		programCollection.glslSources.add("frag") << glu::FragmentSource(src.str());
	}
}